

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O1

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  JBLOCKROW paJVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  jpeg_entropy_encoder *pjVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  int *piVar15;
  _func_void_j_compress_ptr *p_Var16;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)&pjVar2[4].start_pass == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar2[4].start_pass + 4));
      *(uint *)&pjVar2[4].start_pass = cinfo->restart_interval;
      *(uint *)((long)&pjVar2[4].start_pass + 4) =
           *(int *)((long)&pjVar2[4].start_pass + 4) + 1U & 7;
    }
    *(int *)&pjVar2[4].start_pass = *(int *)&pjVar2[4].start_pass + -1;
  }
  paJVar3 = *MCU_data;
  uVar11 = (ulong)cinfo->Se;
  if (0 < (long)uVar11) {
    do {
      uVar6 = (uint)(*paJVar3)[jpeg_natural_order[uVar11]];
      if ((*paJVar3)[jpeg_natural_order[uVar11]] < 0) {
        uVar6 = -uVar6;
      }
      if (uVar6 >> ((byte)cinfo->Al & 0x1f) != 0) goto LAB_00111751;
      bVar4 = 1 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar4);
    uVar11 = 0;
  }
LAB_00111751:
  iVar10 = (int)uVar11;
  uVar12 = uVar11 & 0xffffffff;
  if (0 < iVar10) {
    uVar12 = uVar11 & 0xffffffff;
    do {
      uVar6 = (uint)(*paJVar3)[jpeg_natural_order[uVar12]];
      if ((*paJVar3)[jpeg_natural_order[uVar12]] < 0) {
        uVar6 = -uVar6;
      }
      if (uVar6 >> ((byte)cinfo->Ah & 0x1f) != 0) goto LAB_00111795;
      bVar4 = 1 < (long)uVar12;
      uVar12 = uVar12 - 1;
    } while (bVar4);
    uVar12 = 0;
  }
LAB_00111795:
  iVar1 = cinfo->cur_comp_info[0]->ac_tbl_no;
  iVar8 = cinfo->Ss;
  if (iVar8 <= iVar10) {
LAB_001117c6:
    p_Var16 = (&pjVar2[9].finish_pass)[iVar1];
    lVar14 = (long)(iVar8 * 3 + -3);
    if ((int)uVar12 < iVar8) {
      arith_encode(cinfo,(uchar *)(p_Var16 + lVar14),0);
    }
    piVar15 = jpeg_natural_order + iVar8;
    p_Var16 = p_Var16 + lVar14 + 1;
    iVar13 = iVar8;
    do {
      uVar6 = (uint)(*paJVar3)[*piVar15];
      pjVar9 = pjVar2 + 0xf;
      if ((*paJVar3)[*piVar15] < 0) {
        uVar7 = -uVar6 >> ((byte)cinfo->Al & 0x1f);
        if ((short)uVar7 != 0) {
          if ((uVar7 & 0xffff) != 1) goto LAB_00111890;
          arith_encode(cinfo,(uchar *)p_Var16,1);
          uVar7 = 1;
          goto LAB_0011189c;
        }
      }
      else {
        bVar5 = (byte)cinfo->Al & 0x1f;
        uVar7 = uVar6 >> bVar5;
        if (uVar6 >> bVar5 != 0) goto LAB_00111848;
      }
      arith_encode(cinfo,(uchar *)p_Var16,0);
      iVar13 = iVar13 + 1;
      piVar15 = piVar15 + 1;
      p_Var16 = p_Var16 + 3;
    } while( true );
  }
LAB_001118c3:
  if (iVar8 <= cinfo->Se) {
    arith_encode(cinfo,(uchar *)((&pjVar2[9].finish_pass)[iVar1] + (iVar8 * 3 + -3)),1);
  }
  return 1;
LAB_00111848:
  if (uVar7 == 1) {
    arith_encode(cinfo,(uchar *)p_Var16,1);
    uVar7 = 0;
  }
  else {
LAB_00111890:
    uVar7 = uVar7 & 1;
    pjVar9 = (jpeg_entropy_encoder *)(p_Var16 + 1);
  }
LAB_0011189c:
  arith_encode(cinfo,(uchar *)pjVar9,uVar7);
  iVar8 = iVar13 + 1;
  if (iVar10 <= iVar13) goto code_r0x001118bd;
  goto LAB_001117c6;
code_r0x001118bd:
  iVar8 = iVar13 + 1;
  goto LAB_001118c3;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, k, ke, kex;
  int v;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data block */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Section G.1.3.3: Encoding of AC coefficients */

  /* Establish EOB (end-of-block) index */
  for (ke = cinfo->Se; ke > 0; ke--)
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if ((v = (*block)[jpeg_natural_order[ke]]) >= 0) {
      if (v >>= cinfo->Al) break;
    } else {
      v = -v;
      if (v >>= cinfo->Al) break;
    }

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = ke; kex > 0; kex--)
    if ((v = (*block)[jpeg_natural_order[kex]]) >= 0) {
      if (v >>= cinfo->Ah) break;
    } else {
      v = -v;
      if (v >>= cinfo->Ah) break;
    }

  /* Figure G.10: Encode_AC_Coefficients_SA */
  for (k = cinfo->Ss; k <= ke; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      arith_encode(cinfo, st, 0);       /* EOB decision */
    for (;;) {
      if ((v = (*block)[jpeg_natural_order[k]]) >= 0) {
        if (v >>= cinfo->Al) {
          if (v >> 1)                   /* previously nonzero coef */
            arith_encode(cinfo, st + 2, (v & 1));
          else {                        /* newly nonzero coef */
            arith_encode(cinfo, st + 1, 1);
            arith_encode(cinfo, entropy->fixed_bin, 0);
          }
          break;
        }
      } else {
        v = -v;
        if (v >>= cinfo->Al) {
          if (v >> 1)                   /* previously nonzero coef */
            arith_encode(cinfo, st + 2, (v & 1));
          else {                        /* newly nonzero coef */
            arith_encode(cinfo, st + 1, 1);
            arith_encode(cinfo, entropy->fixed_bin, 1);
          }
          break;
        }
      }
      arith_encode(cinfo, st + 1, 0);  st += 3;  k++;
    }
  }
  /* Encode EOB decision only if k <= cinfo->Se */
  if (k <= cinfo->Se) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 1);
  }

  return TRUE;
}